

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_STATUS JlGetObjectString(JlDataObject *StringObject,char **pString)

{
  JL_STATUS JVar1;
  char *pcVar2;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if (pString != (char **)0x0 && StringObject != (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_SUCCESS;
    if (StringObject->Type == JL_DATA_TYPE_STRING) {
      pcVar2 = (StringObject->field_2).String;
    }
    else {
      JVar1 = JL_STATUS_WRONG_TYPE;
      pcVar2 = (char *)0x0;
    }
    *pString = pcVar2;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlGetObjectString
    (
        JlDataObject const* StringObject,
        char const**        pString
    )
{
    JL_STATUS jlStatus;

    if(     NULL != StringObject
        &&  NULL != pString )
    {
        if( JL_DATA_TYPE_STRING == StringObject->Type )
        {
            *pString = StringObject->String;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            *pString = NULL;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}